

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

int Ssw_ManSweepResimulateDynLocal(Ssw_Man_t *p,int f)

{
  Vec_Ptr_t **ppVVar1;
  Vec_Ptr_t **ppVVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  abctime aVar7;
  Vec_Ptr_t **ppVVar8;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  int iVar10;
  long lVar11;
  int i;
  int iVar12;
  int nSize;
  abctime local_38;
  
  local_38 = Abc_Clock();
  p->nSimRounds = p->nSimRounds + 1;
  Ssw_ManSweepTransferDyn(p);
  p->vResimConsts->nSize = 0;
  ppVVar1 = &p->vResimConsts;
  ppVVar2 = &p->vResimClasses;
  p->vResimClasses->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  iVar10 = p->iNodeStart;
  do {
    if ((p->pPars->nResimDelta + p->iNodeLast <= iVar10) || (p->pAig->vObjs->nSize <= iVar10)) {
      p->nVisCounter = p->nVisCounter + 1;
      for (iVar10 = 0; iVar10 < (*ppVVar1)->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(*ppVVar1,iVar10);
        Ssw_SmlSimulateOneDyn_rec(p->pSml,pAVar5,p->nFrames + -1,p->pVisited,p->nVisCounter);
      }
      for (iVar10 = 0; iVar10 < (*ppVVar2)->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(*ppVVar2,iVar10);
        ppAVar6 = Ssw_ClassesReadClass(p->ppClasses,pAVar5,&nSize);
        for (lVar11 = 0; lVar11 < nSize; lVar11 = lVar11 + 1) {
          Ssw_SmlSimulateOneDyn_rec
                    (p->pSml,ppAVar6[lVar11],p->nFrames + -1,p->pVisited,p->nVisCounter);
        }
      }
      pAVar5 = (Aig_Obj_t *)p->vResimConsts;
      iVar10 = Ssw_ClassesRefineConst1Group(p->ppClasses,(Vec_Ptr_t *)pAVar5,1);
      iVar12 = 0;
      uVar9 = extraout_RDX;
      for (i = 0; i < (*ppVVar2)->nSize; i = i + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(*ppVVar2,i);
        iVar4 = Ssw_ClassesRefineOneClass(p->ppClasses,pAVar5,1);
        iVar12 = iVar12 + iVar4;
        uVar9 = extraout_RDX_00;
      }
      Vec_PtrCleanSimInfo(p->vSimInfo,(int)pAVar5,(int)uVar9);
      p->nPatterns = 0;
      p->nSimRounds = p->nSimRounds + 1;
      aVar7 = Abc_Clock();
      p->timeSimSat = p->timeSimSat + (aVar7 - local_38);
      return (int)(0 < iVar12 || 0 < iVar10);
    }
    pAVar5 = Aig_ManObj(p->pAig,iVar10);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      pAVar3 = p->pAig;
      ppAVar6 = pAVar3->pReprs;
      ppVVar8 = ppVVar1;
      if (ppAVar6 == (Aig_Obj_t **)0x0) {
        if (pAVar3->pConst1 != (Aig_Obj_t *)0x0) goto LAB_0056483f;
      }
      else if (ppAVar6[pAVar5->Id] != pAVar3->pConst1) {
        pAVar5 = ppAVar6[pAVar5->Id];
        if ((pAVar5 == (Aig_Obj_t *)0x0) || (pAVar5->TravId == pAVar3->nTravIds)) goto LAB_0056483f;
        pAVar5->TravId = pAVar3->nTravIds;
        ppVVar8 = ppVVar2;
      }
      Vec_PtrPush(*ppVVar8,pAVar5);
    }
LAB_0056483f:
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepResimulateDynLocal( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj, * pRepr, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    p->nSimRounds++;
    // transfer PI simulation information from storage
//    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    Ssw_ManSweepTransferDyn( p );
    // determine const1 cands and classes to be simulated
    Vec_PtrClear( p->vResimConsts );
    Vec_PtrClear( p->vResimClasses );
    Aig_ManIncrementTravId( p->pAig );
    for ( i = p->iNodeStart; i < p->iNodeLast + p->pPars->nResimDelta; i++ )
    {
        if ( i >= Aig_ManObjNumMax( p->pAig ) )
            break;
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj == NULL )
            continue;
        if ( Ssw_ObjIsConst1Cand(p->pAig, pObj) )
        {
            Vec_PtrPush( p->vResimConsts, pObj );
            continue;
        }
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p->pAig, pRepr) )
            continue;
        Aig_ObjSetTravIdCurrent(p->pAig, pRepr);
        Vec_PtrPush( p->vResimClasses, pRepr );
    }
    // simulate internal nodes
//    Ssw_SmlSimulateOneFrame( p->pSml );
//    Ssw_SmlSimulateOne( p->pSml );
    // resimulate dynamically
//    Aig_ManIncrementTravId( p->pAig );
//    Aig_ObjIsTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    p->nVisCounter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimConsts, pObj, i )
        Ssw_SmlSimulateOneDyn_rec( p->pSml, pObj, p->nFrames-1, p->pVisited, p->nVisCounter );
    // resimulate the cone of influence of the cand classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
    {
        ppClass = Ssw_ClassesReadClass( p->ppClasses, pRepr, &nSize );
        for ( k = 0; k < nSize; k++ )
            Ssw_SmlSimulateOneDyn_rec( p->pSml, ppClass[k], p->nFrames-1, p->pVisited, p->nVisCounter );
    }

    // check equivalence classes
//    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
//    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // refine these nodes
    RetValue1 = Ssw_ClassesRefineConst1Group( p->ppClasses, p->vResimConsts, 1 );
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
        RetValue2 += Ssw_ClassesRefineOneClass( p->ppClasses, pRepr, 1 );

    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}